

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O2

void av1_fwd_txfm2d_16x4_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  char cVar1;
  code *pcVar2;
  code *pcVar3;
  uint uVar4;
  int8_t *piVar5;
  int iVar6;
  undefined7 in_register_00000009;
  int16_t *input_00;
  int flipud;
  int fliplr;
  __m128i *in_00;
  long lVar7;
  int16_t *local_158;
  __m128i in [16];
  
  piVar5 = av1_fwd_txfm_shift_ls[0xe];
  uVar4 = (uint)CONCAT71(in_register_00000009,tx_type);
  fliplr = 0;
  iVar6 = 0;
  if (uVar4 < 0x10) {
    if ((0x4110U >> (uVar4 & 0x1f) & 1) == 0) {
      flipud = 0;
      if (((0x80a0U >> (uVar4 & 0x1f) & 1) != 0) || (flipud = 1, uVar4 == 6)) {
        input_00 = input + 8;
        fliplr = 1;
        local_158 = input;
        goto LAB_00399d28;
      }
    }
    else {
      iVar6 = 1;
    }
  }
  flipud = iVar6;
  local_158 = input + 8;
  input_00 = input;
LAB_00399d28:
  pcVar2 = *(code **)((long)col_highbd_txfm4x4_arr + (ulong)(uVar4 * 8));
  pcVar3 = *(code **)((long)row_highbd_txfm8x16_arr + (ulong)(uVar4 * 8));
  cVar1 = *av1_fwd_txfm_shift_ls[0xe];
  load_buffer_8x4(input_00,in,stride,flipud,fliplr,(int)cVar1);
  load_buffer_8x4(local_158,in + 8,stride,flipud,fliplr,(int)cVar1);
  for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 0x40) {
    in_00 = (__m128i *)((long)in[0] + lVar7);
    (*pcVar2)(in_00,in_00,0xd,1);
    transpose_32bit_4x4(in_00,in_00);
  }
  col_txfm_8x8_rounding(in,-(int)piVar5[1]);
  (*pcVar3)(in,coeff,0xd,1);
  return;
}

Assistant:

void av1_fwd_txfm2d_16x4_sse4_1(const int16_t *input, int32_t *coeff,
                                int stride, TX_TYPE tx_type, int bd) {
  __m128i in[16];
  __m128i *outcoeff128 = (__m128i *)coeff;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_16X4];
  const int txw_idx = get_txw_idx(TX_16X4);
  const int txh_idx = get_txh_idx(TX_16X4);
  const int txfm_size_col = tx_size_wide[TX_16X4];
  const int txfm_size_row = tx_size_high[TX_16X4];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const fwd_transform_1d_sse4_1 col_txfm = col_highbd_txfm4x4_arr[tx_type];
  const fwd_transform_1d_sse4_1 row_txfm = row_highbd_txfm8x16_arr[tx_type];
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  // col transform
  load_buffer_16x4(input, in, stride, ud_flip, lr_flip, shift[0]);

  for (int i = 0; i < (txfm_size_col >> 2); i++) {
    __m128i *cur_in = &in[i * txfm_size_row];
    col_txfm(cur_in, cur_in, bitcol, 1);
    transpose_32bit_4x4(cur_in, cur_in);
  }
  col_txfm_8x8_rounding(in, -shift[1]);

  // row transform
  row_txfm(in, outcoeff128, bitrow, 1);
  (void)bd;
}